

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_1c9774::BuildEngineImpl::~BuildEngineImpl(BuildEngineImpl *this)

{
  _Map_pointer pppTVar1;
  _Map_pointer ppTVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppRVar4;
  pointer ppTVar5;
  _Map_pointer pppTVar6;
  __buckets_ptr pp_Var7;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
  *p_Var8;
  __buckets_ptr pp_Var9;
  pointer pRVar10;
  pointer pTVar11;
  _Map_pointer ppTVar12;
  ExecutionQueue *pEVar13;
  pointer pcVar14;
  BuildDB *pBVar15;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
  *this_00;
  int iVar16;
  __node_ptr in_RSI;
  _Map_pointer pppTVar17;
  _Map_pointer ppTVar18;
  _Map_pointer pppTVar19;
  _Map_pointer ppTVar20;
  
  (this->super_BuildDBDelegate)._vptr_BuildDBDelegate = (_func_int **)&PTR__BuildEngineImpl_001ff038
  ;
  iVar16 = pthread_mutex_lock((pthread_mutex_t *)&this->buildEngineMutex);
  if (iVar16 != 0) {
    std::__throw_system_error(iVar16);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->buildEngineMutex);
  ppRVar4 = (this->ruleScanRecordBlocks).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 != (pointer)0x0) {
    in_RSI = (__node_ptr)
             ((long)(this->ruleScanRecordBlocks).
                    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar4);
    operator_delete(ppRVar4,(ulong)in_RSI);
  }
  ppRVar4 = (this->freeRuleScanRecords).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 != (pointer)0x0) {
    in_RSI = (__node_ptr)
             ((long)(this->freeRuleScanRecords).
                    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar4);
    operator_delete(ppRVar4,(ulong)in_RSI);
  }
  std::condition_variable::~condition_variable(&this->finishedTaskInfosCondition);
  ppTVar5 = (this->finishedTaskInfos).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar5 != (pointer)0x0) {
    in_RSI = (__node_ptr)
             ((long)(this->finishedTaskInfos).
                    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar5);
    operator_delete(ppTVar5,(ulong)in_RSI);
  }
  pppTVar17 = (this->readyTaskInfos).
              super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ._M_impl.super__Deque_impl_data._M_map;
  if (pppTVar17 != (_Map_pointer)0x0) {
    pppTVar19 = (this->readyTaskInfos).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    pppTVar6 = (this->readyTaskInfos).
               super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    if (pppTVar19 < pppTVar6 + 1) {
      pppTVar19 = pppTVar19 + -1;
      do {
        pppTVar1 = pppTVar19 + 1;
        pppTVar19 = pppTVar19 + 1;
        operator_delete(*pppTVar1,0x200);
      } while (pppTVar19 < pppTVar6);
      pppTVar17 = (this->readyTaskInfos).
                  super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                  ._M_impl.super__Deque_impl_data._M_map;
    }
    in_RSI = (__node_ptr)
             ((this->readyTaskInfos).
              super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ._M_impl.super__Deque_impl_data._M_map_size << 3);
    operator_delete(pppTVar17,(ulong)in_RSI);
  }
  std::
  _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->taskInfos)._M_h);
  pp_Var7 = (this->taskInfos)._M_h._M_buckets;
  if (&(this->taskInfos)._M_h._M_single_bucket != pp_Var7) {
    in_RSI = (__node_ptr)((this->taskInfos)._M_h._M_bucket_count << 3);
    operator_delete(pp_Var7,(ulong)in_RSI);
  }
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
             *)(this->ruleInfos)._M_h._M_before_begin._M_nxt;
  while (this_00 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
          *)0x0) {
    p_Var8 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
               **)this_00;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
    ::_M_deallocate_node(this_00,in_RSI);
    this_00 = p_Var8;
  }
  memset((this->ruleInfos)._M_h._M_buckets,0,(this->ruleInfos)._M_h._M_bucket_count << 3);
  (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ruleInfos)._M_h._M_element_count = 0;
  pp_Var9 = (this->ruleInfos)._M_h._M_buckets;
  if (&(this->ruleInfos)._M_h._M_single_bucket != pp_Var9) {
    operator_delete(pp_Var9,(this->ruleInfos)._M_h._M_bucket_count << 3);
  }
  pRVar10 = (this->ruleInfosToScan).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar10 != (pointer)0x0) {
    operator_delete(pRVar10,(long)(this->ruleInfosToScan).
                                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar10
                   );
  }
  pTVar11 = (this->finishedInputRequests).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar11 != (pointer)0x0) {
    operator_delete(pTVar11,(long)(this->finishedInputRequests).
                                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar11
                   );
  }
  ppTVar18 = (this->inputRequests).
             super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
             ._M_impl.super__Deque_impl_data._M_map;
  if (ppTVar18 != (_Map_pointer)0x0) {
    ppTVar20 = (this->inputRequests).
               super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    ppTVar12 = (this->inputRequests).
               super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    if (ppTVar20 < ppTVar12 + 1) {
      ppTVar20 = ppTVar20 + -1;
      do {
        ppTVar2 = ppTVar20 + 1;
        ppTVar20 = ppTVar20 + 1;
        operator_delete(*ppTVar2,0x200);
      } while (ppTVar20 < ppTVar12);
      ppTVar18 = (this->inputRequests).
                 super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                 ._M_impl.super__Deque_impl_data._M_map;
    }
    operator_delete(ppTVar18,(this->inputRequests).
                             super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                             ._M_impl.super__Deque_impl_data._M_map_size << 3);
  }
  operator_delete((this->cancellationDelegates).
                  super_DenseSetImpl<llbuild::core::CancellationDelegate_*,_llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>_>
                  .TheMap.Buckets);
  pEVar13 = (this->executionQueue)._M_t.
            super___uniq_ptr_impl<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::basic::ExecutionQueue_*,_std::default_delete<llbuild::basic::ExecutionQueue>_>
            .super__Head_base<0UL,_llbuild::basic::ExecutionQueue_*,_false>._M_head_impl;
  if (pEVar13 != (ExecutionQueue *)0x0) {
    (*pEVar13->_vptr_ExecutionQueue[1])();
  }
  (this->executionQueue)._M_t.
  super___uniq_ptr_impl<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::ExecutionQueue_*,_std::default_delete<llbuild::basic::ExecutionQueue>_>
  .super__Head_base<0UL,_llbuild::basic::ExecutionQueue_*,_false>._M_head_impl =
       (ExecutionQueue *)0x0;
  pcVar14 = (this->traceFile)._M_dataplus._M_p;
  paVar3 = &(this->traceFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar14 != paVar3) {
    operator_delete(pcVar14,paVar3->_M_allocated_capacity + 1);
  }
  std::
  unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
  ::~unique_ptr(&this->trace);
  pBVar15 = (this->db)._M_t.
            super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
            .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl;
  if (pBVar15 != (BuildDB *)0x0) {
    (*pBVar15->_vptr_BuildDB[1])();
  }
  (this->db)._M_t.
  super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>._M_t.
  super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>.
  super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl = (BuildDB *)0x0;
  llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::~StringMap(&this->keyTable);
  llbuild::core::BuildDBDelegate::~BuildDBDelegate(&this->super_BuildDBDelegate);
  return;
}

Assistant:

~BuildEngineImpl() {
    // Make sure that there aren't any currently running builds before
    // tearing down.
    std::lock_guard<std::mutex> lock(buildEngineMutex);
  }